

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O1

void NewObjInGlobal(void)

{
  Function *prototype;
  int iVar1;
  ulong uVar2;
  _Elt_pointer ppFVar3;
  ulong uVar4;
  Closure *c;
  String *local_10;
  
  iVar1 = rand();
  iVar1 = iVar1 % 100;
  if (iVar1 < 0x14) {
    local_10 = (String *)luna::GC::NewTable(&g_gc,GCGen2);
    if (g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<luna::Table*,std::allocator<luna::Table*>>::_M_push_back_aux<luna::Table*>
                ((deque<luna::Table*,std::allocator<luna::Table*>> *)&g_globalTable,
                 (Table **)&local_10);
    }
    else {
      *g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = (Table *)local_10;
      g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 1;
    }
  }
  else if (iVar1 < 0x32) {
    local_10 = luna::GC::NewString(&g_gc,GCGen2);
    if (g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<luna::String*,std::allocator<luna::String*>>::_M_push_back_aux<luna::String*>
                ((deque<luna::String*,std::allocator<luna::String*>> *)&g_globalString,&local_10);
    }
    else {
      *g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = local_10;
      g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl
           .super__Deque_impl_data._M_finish._M_cur + 1;
    }
  }
  else if (iVar1 < 0x3c) {
    if (g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur !=
        g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      uVar4 = ((long)g_globalFunction.
                     super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_last -
               (long)g_globalFunction.
                     super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur >> 3) +
              ((long)g_globalFunction.
                     super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur -
               (long)g_globalFunction.
                     super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)g_globalFunction.
                               super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)g_globalFunction.
                              super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(g_globalFunction.
                      super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x40;
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        iVar1 = rand();
        uVar4 = (ulong)(long)iVar1 % uVar4;
      }
      uVar2 = ((long)g_globalFunction.
                     super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur -
               (long)g_globalFunction.
                     super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first >> 3) + uVar4;
      if (uVar2 < 0x40) {
        ppFVar3 = g_globalFunction.
                  super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur + uVar4;
      }
      else {
        uVar4 = uVar2 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar2) {
          uVar4 = uVar2 >> 6;
        }
        ppFVar3 = g_globalFunction.
                  super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar4] + uVar2 + uVar4 * -0x40;
      }
      prototype = *ppFVar3;
      local_10 = (String *)luna::GC::NewClosure(&g_gc,GCGen1);
      luna::Closure::SetPrototype((Closure *)local_10,prototype);
      if (g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<luna::Closure*,std::allocator<luna::Closure*>>::
        _M_push_back_aux<luna::Closure*const&>
                  ((deque<luna::Closure*,std::allocator<luna::Closure*>> *)&g_globalClosure,
                   (Closure **)&local_10);
      }
      else {
        *g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur = (Closure *)local_10;
        g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl
        .super__Deque_impl_data._M_finish._M_cur =
             g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    }
  }
  return;
}

Assistant:

inline T RandomRange(T min, T max)
{
    return rand() % (max + 1 - min) + min;
}